

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O2

void __thiscall
jessilib::callback_with_iterations::callback_with_iterations
          (callback_with_iterations *this,callback_with_iterations *in_callback)

{
  std::function<void_(jessilib::timer_&)>::function(&this->m_callback,&in_callback->m_callback);
  (this->m_iterations).super___atomic_base<unsigned_long>._M_i =
       (in_callback->m_iterations).super___atomic_base<unsigned_long>._M_i;
  cancel_token::cancel_token(&this->m_cancel_token);
  return;
}

Assistant:

callback_with_iterations(callback_with_iterations&& in_callback)
		: m_callback{ std::move(in_callback.m_callback) },
		m_iterations{ in_callback.m_iterations.load() } {
		// Empty ctor body
	}